

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void render_element(element_t *element,render_context_t *context,render_state_t *state)

{
  render_state_t *state_local;
  render_context_t *context_local;
  element_t *element_local;
  
  switch(element->id) {
  case 1:
    render_circle(element,context,state);
    break;
  case 4:
    render_ellipse(element,context,state);
    break;
  case 5:
    render_g(element,context,state);
    break;
  case 6:
    render_image(element,context,state);
    break;
  case 7:
    render_line(element,context,state);
    break;
  case 9:
    render_path(element,context,state);
    break;
  case 10:
  case 0xb:
    render_poly(element,context,state);
    break;
  case 0xd:
    render_rect(element,context,state);
    break;
  case 0xf:
    render_svg(element,context,state);
    break;
  case 0x11:
    render_use(element,context,state);
  }
  return;
}

Assistant:

static void render_element(const element_t* element, const render_context_t* context, render_state_t* state)
{
    switch(element->id) {
    case TAG_SVG:
        render_svg(element, context, state);
        break;
    case TAG_USE:
        render_use(element, context, state);
        break;
    case TAG_G:
        render_g(element, context, state);
        break;
    case TAG_LINE:
        render_line(element, context, state);
        break;
    case TAG_ELLIPSE:
        render_ellipse(element, context, state);
        break;
    case TAG_CIRCLE:
        render_circle(element, context, state);
        break;
    case TAG_RECT:
        render_rect(element, context, state);
        break;
    case TAG_POLYLINE:
    case TAG_POLYGON:
        render_poly(element, context, state);
        break;
    case TAG_PATH:
        render_path(element, context, state);
        break;
    case TAG_IMAGE:
        render_image(element, context, state);
        break;
    }
}